

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

MemPage * btreePageLookup(BtShared *pBt,Pgno pgno)

{
  DbPage *pDbPage;
  MemPage *pMVar1;
  
  pDbPage = sqlite3PagerLookup(pBt->pPager,pgno);
  if (pDbPage != (DbPage *)0x0) {
    pMVar1 = btreePageFromDbPage(pDbPage,pgno,pBt);
    return pMVar1;
  }
  return (MemPage *)0x0;
}

Assistant:

static MemPage *btreePageLookup(BtShared *pBt, Pgno pgno){
  DbPage *pDbPage;
  assert( sqlite3_mutex_held(pBt->mutex) );
  pDbPage = sqlite3PagerLookup(pBt->pPager, pgno);
  if( pDbPage ){
    return btreePageFromDbPage(pDbPage, pgno, pBt);
  }
  return 0;
}